

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

void Catch::Detail::registerReporterImpl(string *name,IReporterFactoryPtr *reporterPtr)

{
  IReporterFactory *pIVar1;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar2;
  
  pSVar2 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  pIVar1 = reporterPtr->m_ptr;
  reporterPtr->m_ptr = (IReporterFactory *)0x0;
  (*(pSVar2->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[2])
            (&(pSVar2->super_RegistryHub).super_IMutableRegistryHub,name);
  if (pIVar1 != (IReporterFactory *)0x0) {
    (*pIVar1->_vptr_IReporterFactory[1])();
  }
  return;
}

Assistant:

void registerReporterImpl( std::string const& name,
                                   IReporterFactoryPtr reporterPtr ) {
            CATCH_TRY {
                getMutableRegistryHub().registerReporter(
                    name, CATCH_MOVE( reporterPtr ) );
            }